

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O3

void __thiscall ast::Dir_align::Dir_align(Dir_align *this,Expression *size,Location left)

{
  byte bVar1;
  uint section;
  long lVar2;
  uint uVar3;
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  (this->super_Directive).super_Statement.location.unit = left.unit;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_align_0013c900;
  this->size = size;
  lVar2 = Sections::current_section;
  section = *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_index = section;
  uVar3 = *(uint *)(lVar2 + 0x30);
  (this->super_Directive).super_Statement.section_offset = uVar3;
  bVar1 = (byte)size->value;
  uVar3 = (((uVar3 + (1 << (bVar1 & 0x1f))) - 1 >> (bVar1 & 0x1f)) << (bVar1 & 0x1f)) - uVar3;
  (this->super_Directive).super_Statement.size_in_memory = uVar3;
  Sections::increase(section,uVar3);
  return;
}

Assistant:

Dir_align::Dir_align (Expression *size, Location left) :
	Directive {left}, size {size} 
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = Sections::align(section_offset, size->get_value()) - section_offset;
	Sections::increase(section_index, size_in_memory);
}